

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<long_double>::GetSub
          (TPZMatrix<long_double> *this,int64_t sRow,int64_t sCol,int64_t rowSize,int64_t colSize,
          TPZFMatrix<long_double> *A)

{
  int iVar1;
  int64_t c;
  long lVar2;
  long lVar3;
  long local_58;
  undefined1 local_48 [24];
  
  if ((rowSize + sRow <= (this->super_TPZBaseMatrix).fRow) &&
     (colSize + sCol <= (this->super_TPZBaseMatrix).fCol)) {
    (*(A->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
              (A,rowSize,colSize);
    lVar3 = 0;
    if (colSize < 1) {
      colSize = lVar3;
    }
    local_58 = sRow;
    if (rowSize < 1) {
      rowSize = lVar3;
    }
    for (; lVar3 != rowSize; lVar3 = lVar3 + 1) {
      for (lVar2 = 0; colSize != lVar2; lVar2 = lVar2 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (this,local_58,sCol + lVar2);
        (*(A->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x23])(A,lVar3,lVar2,local_48);
      }
      local_58 = local_58 + 1;
    }
    return 1;
  }
  iVar1 = Error("GetSub <t.he sub-matrix is too big>",(char *)0x0);
  return iVar1;
}

Assistant:

int TPZMatrix<TVar>::GetSub(const int64_t sRow,const int64_t sCol,const int64_t rowSize,
							const int64_t colSize, TPZFMatrix<TVar> & A ) const {
    if ( ((sRow + rowSize) > Rows()) || ((sCol + colSize) > Cols()) ) {
        return( Error( "GetSub <t.he sub-matrix is too big>" ) );
    }
    A.Resize( rowSize, colSize );
    int64_t row = sRow;
    for ( int64_t r = 0; r < rowSize; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = 0; c < colSize; c++, col++ ) {
            A.PutVal( r, c, GetVal( row, col ) );
        }
    }
    return( 1 );
}